

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_load_seg_x86_64(CPUX86State *env,int seg_reg,int selector)

{
  uint uVar1;
  int iVar2;
  uint32_t e1_00;
  uint uVar3;
  uint32_t uVar4;
  abi_ptr addr;
  uintptr_t unaff_retaddr;
  target_ulong ptr;
  SegmentCache *pSStack_38;
  int index;
  SegmentCache *dt;
  int rpl;
  int dpl;
  int cpl;
  uint32_t e2;
  uint32_t e1;
  int selector_local;
  int seg_reg_local;
  CPUX86State *env_local;
  
  uVar1 = env->hflags & 3;
  if ((selector & 0xfffcU) == 0) {
    if ((seg_reg == 2) && (((env->hflags & 0x8000) == 0 || (uVar1 == 3)))) {
      raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
    }
    cpu_x86_load_seg_cache(env,seg_reg,selector & 0xffffU,0,0,0);
  }
  else {
    if ((selector & 4U) == 0) {
      pSStack_38 = &env->gdt;
    }
    else {
      pSStack_38 = &env->ldt;
    }
    if (pSStack_38->limit < (selector & 0xfff8U) + 7) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    addr = pSStack_38->base + (long)(int)(selector & 0xfff8U);
    iVar2 = cpu_mmu_index_kernel(env);
    e1_00 = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar2,unaff_retaddr);
    iVar2 = cpu_mmu_index_kernel(env);
    dpl = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,iVar2,unaff_retaddr);
    if ((dpl & 0x1000U) == 0) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    uVar3 = (uint)dpl >> 0xd & 3;
    if (seg_reg == 2) {
      if (((dpl & 0x800U) != 0) || ((dpl & 0x200U) == 0)) {
        raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
      }
      if (((selector & 3U) != uVar1) || (uVar3 != uVar1)) {
        raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
      }
    }
    else {
      if ((dpl & 0xa00U) == 0x800) {
        raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
      }
      if ((((dpl & 0x800U) == 0) || ((dpl & 0x400U) == 0)) &&
         ((uVar3 < uVar1 || (uVar3 < (selector & 3U))))) {
        raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
      }
    }
    if ((dpl & 0x8000U) == 0) {
      if (seg_reg != 2) {
        raise_exception_err_ra_x86_64(env,0xb,selector & 0xfffc,unaff_retaddr);
      }
      raise_exception_err_ra_x86_64(env,0xc,selector & 0xfffc,unaff_retaddr);
    }
    if ((dpl & 0x100U) == 0) {
      dpl = dpl | 0x100;
      iVar2 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,addr + 4,dpl,iVar2,unaff_retaddr);
    }
    uVar4 = get_seg_base(e1_00,dpl);
    uVar1 = get_seg_limit(e1_00,dpl);
    cpu_x86_load_seg_cache(env,seg_reg,selector & 0xffffU,(ulong)uVar4,uVar1,dpl);
  }
  return;
}

Assistant:

void helper_load_seg(CPUX86State *env, int seg_reg, int selector)
{
    uint32_t e1, e2;
    int cpl, dpl, rpl;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    selector &= 0xffff;
    cpl = env->hflags & HF_CPL_MASK;
    if ((selector & 0xfffc) == 0) {
        /* null selector case */
        if (seg_reg == R_SS
#ifdef TARGET_X86_64
            && (!(env->hflags & HF_CS64_MASK) || cpl == 3)
#endif
            ) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector, 0, 0, 0);
    } else {

        if (selector & 0x4) {
            dt = &env->ldt;
        } else {
            dt = &env->gdt;
        }
        index = selector & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());

        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_SS) {
            /* must be writable segment */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
            if (rpl != cpl || dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
        } else {
            /* must be readable segment */
            if ((e2 & (DESC_CS_MASK | DESC_R_MASK)) == DESC_CS_MASK) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }

            if (!(e2 & DESC_CS_MASK) || !(e2 & DESC_C_MASK)) {
                /* if not conforming code, test rights */
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
                }
            }
        }

        if (!(e2 & DESC_P_MASK)) {
            if (seg_reg == R_SS) {
                raise_exception_err_ra(env, EXCP0C_STACK, selector & 0xfffc, GETPC());
            } else {
                raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
            }
        }

        /* set the access bit if not already set */
        if (!(e2 & DESC_A_MASK)) {
            e2 |= DESC_A_MASK;
            cpu_stl_kernel_ra(env, ptr + 4, e2, GETPC());
        }

        cpu_x86_load_seg_cache(env, seg_reg, selector,
                       get_seg_base(e1, e2),
                       get_seg_limit(e1, e2),
                       e2);
#if 0
        qemu_log("load_seg: sel=0x%04x base=0x%08lx limit=0x%08lx flags=%08x\n",
                selector, (unsigned long)sc->base, sc->limit, sc->flags);
#endif
    }
}